

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O0

IHEVCD_ERROR_T ihevcd_parse_pps(codec_t *ps_codec)

{
  WORD8 WVar1;
  char cVar2;
  char cVar3;
  pps_t *ppVar4;
  sps_t *psVar5;
  tile_t *ptVar6;
  UWORD32 UVar7;
  WORD32 WVar8;
  int iVar9;
  bitstrm_t *ps_bitstrm_00;
  pps_t *ppVar10;
  long lVar11;
  codec_t *in_RDI;
  WORD32 scaling_mat_offset [20];
  tile_t *ps_tile_1;
  tile_t *ps_tile;
  WORD32 j;
  WORD32 i;
  WORD32 start;
  bitstrm_t *ps_bitstrm;
  sps_t *ps_sps;
  pps_t *ps_pps;
  WORD32 pps_id;
  WORD32 value;
  IHEVCD_ERROR_T ret;
  undefined1 local_a8 [8];
  bitstrm_t *in_stack_ffffffffffffff60;
  bitstrm_t *in_stack_ffffffffffffff68;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_44;
  int local_40;
  int local_3c;
  UWORD32 local_1c;
  IHEVCD_ERROR_T local_4;
  
  local_4 = 0;
  ps_bitstrm_00 = &(in_RDI->s_parse).s_bitstrm;
  if (in_RDI->i4_sps_done == 0) {
    local_4 = IHEVCD_INVALID_HEADER;
  }
  else {
    local_1c = ihevcd_uev(in_stack_ffffffffffffff60);
    if ((0x40 < (int)local_1c) || ((int)local_1c < 0)) {
      if (in_RDI->i4_pps_done != 0) {
        return IHEVCD_UNSUPPORTED_PPS_ID;
      }
      local_1c = 0;
    }
    ppVar4 = (in_RDI->s_parse).ps_pps_base;
    ppVar10 = ppVar4 + 0x40;
    ppVar4[0x40].i1_pps_id = (WORD8)local_1c;
    UVar7 = ihevcd_uev(in_stack_ffffffffffffff60);
    ppVar4[0x40].i1_sps_id = (WORD8)UVar7;
    if (ppVar4[0x40].i1_sps_id < '\x10') {
      if (ppVar4[0x40].i1_sps_id < '\0') {
        WVar1 = '\0';
      }
      else {
        WVar1 = ppVar4[0x40].i1_sps_id;
      }
    }
    else {
      WVar1 = '\x0f';
    }
    ppVar4[0x40].i1_sps_id = WVar1;
    psVar5 = (in_RDI->s_parse).ps_sps_base;
    cVar2 = ppVar4[0x40].i1_sps_id;
    if (psVar5[(int)cVar2].i1_sps_valid == '\0') {
      local_4 = IHEVCD_INVALID_HEADER;
    }
    else {
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
      ppVar4[0x40].i1_dependent_slice_enabled_flag = (WORD8)UVar7;
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
      ppVar4[0x40].i1_output_flag_present_flag = (WORD8)UVar7;
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,3);
      ppVar4[0x40].i1_num_extra_slice_header_bits = (WORD8)UVar7;
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
      ppVar4[0x40].i1_sign_data_hiding_flag = (WORD8)UVar7;
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
      ppVar4[0x40].i1_cabac_init_present_flag = (WORD8)UVar7;
      UVar7 = ihevcd_uev(in_stack_ffffffffffffff60);
      ppVar4[0x40].i1_num_ref_idx_l0_default_active = (char)UVar7 + '\x01';
      UVar7 = ihevcd_uev(in_stack_ffffffffffffff60);
      ppVar4[0x40].i1_num_ref_idx_l1_default_active = (char)UVar7 + '\x01';
      WVar8 = ihevcd_sev(in_stack_ffffffffffffff68);
      ppVar4[0x40].i1_pic_init_qp = (char)WVar8 + '\x1a';
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
      ppVar4[0x40].i1_constrained_intra_pred_flag = (WORD8)UVar7;
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
      ppVar4[0x40].i1_transform_skip_enabled_flag = (WORD8)UVar7;
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
      ppVar4[0x40].i1_cu_qp_delta_enabled_flag = (WORD8)UVar7;
      if (ppVar4[0x40].i1_cu_qp_delta_enabled_flag == '\0') {
        ppVar4[0x40].i1_diff_cu_qp_delta_depth = '\0';
      }
      else {
        UVar7 = ihevcd_uev(in_stack_ffffffffffffff60);
        ppVar4[0x40].i1_diff_cu_qp_delta_depth = (WORD8)UVar7;
      }
      ppVar4[0x40].i1_log2_min_cu_qp_delta_size =
           psVar5[(int)cVar2].i1_log2_ctb_size - ppVar4[0x40].i1_diff_cu_qp_delta_depth;
      WVar8 = ihevcd_sev(in_stack_ffffffffffffff68);
      ppVar4[0x40].i1_pic_cb_qp_offset = (WORD8)WVar8;
      WVar8 = ihevcd_sev(in_stack_ffffffffffffff68);
      ppVar4[0x40].i1_pic_cr_qp_offset = (WORD8)WVar8;
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
      ppVar4[0x40].i1_pic_slice_level_chroma_qp_offsets_present_flag = (WORD8)UVar7;
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
      ppVar4[0x40].i1_weighted_pred_flag = (WORD8)UVar7;
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
      ppVar4[0x40].i1_weighted_bipred_flag = (WORD8)UVar7;
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
      ppVar4[0x40].i1_transquant_bypass_enable_flag = (WORD8)UVar7;
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
      ppVar4[0x40].i1_tiles_enabled_flag = (WORD8)UVar7;
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
      ppVar4[0x40].i1_entropy_coding_sync_enabled_flag = (WORD8)UVar7;
      ppVar4[0x40].i1_loop_filter_across_tiles_enabled_flag = '\0';
      if (ppVar4[0x40].i1_tiles_enabled_flag == '\0') {
        ppVar4[0x40].i1_num_tile_columns = '\x01';
        ppVar4[0x40].i1_num_tile_rows = '\x01';
        ppVar4[0x40].i1_uniform_spacing_flag = '\x01';
        (ppVar4[0x40].ps_tile)->u1_pos_x = '\0';
        (ppVar4[0x40].ps_tile)->u1_pos_y = '\0';
        (ppVar4[0x40].ps_tile)->u2_wd = psVar5[(int)cVar2].i2_pic_wd_in_ctb;
        (ppVar4[0x40].ps_tile)->u2_ht = psVar5[(int)cVar2].i2_pic_ht_in_ctb;
      }
      else {
        UVar7 = ihevcd_uev(in_stack_ffffffffffffff60);
        ppVar4[0x40].i1_num_tile_columns = (char)UVar7 + '\x01';
        UVar7 = ihevcd_uev(in_stack_ffffffffffffff60);
        ppVar4[0x40].i1_num_tile_rows = (char)UVar7 + '\x01';
        if ((((ppVar4[0x40].i1_num_tile_columns < '\x01') ||
             ((int)psVar5[(int)cVar2].i2_pic_wd_in_ctb < (int)ppVar4[0x40].i1_num_tile_columns)) ||
            (ppVar4[0x40].i1_num_tile_rows < '\x01')) ||
           ((int)psVar5[(int)cVar2].i2_pic_ht_in_ctb < (int)ppVar4[0x40].i1_num_tile_rows)) {
          return IHEVCD_INVALID_HEADER;
        }
        UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
        ppVar4[0x40].i1_uniform_spacing_flag = (WORD8)UVar7;
        local_3c = 0;
        for (local_40 = 0; local_40 < ppVar4[0x40].i1_num_tile_columns; local_40 = local_40 + 1) {
          if (ppVar4[0x40].i1_uniform_spacing_flag == '\0') {
            if (local_40 < ppVar4[0x40].i1_num_tile_columns + -1) {
              UVar7 = ihevcd_uev(in_stack_ffffffffffffff60);
              iVar9 = UVar7 + 1;
            }
            else {
              iVar9 = psVar5[(int)cVar2].i2_pic_wd_in_ctb - local_3c;
            }
          }
          else {
            iVar9 = ((local_40 + 1) * (int)psVar5[(int)cVar2].i2_pic_wd_in_ctb) /
                    (int)ppVar4[0x40].i1_num_tile_columns -
                    (local_40 * psVar5[(int)cVar2].i2_pic_wd_in_ctb) /
                    (int)ppVar4[0x40].i1_num_tile_columns;
          }
          for (local_44 = 0; local_44 < ppVar4[0x40].i1_num_tile_rows; local_44 = local_44 + 1) {
            ptVar6 = ppVar4[0x40].ps_tile;
            cVar3 = ppVar4[0x40].i1_num_tile_columns;
            ptVar6[(long)(local_44 * cVar3) + (long)local_40].u1_pos_x = (UWORD8)local_3c;
            ptVar6[(long)(local_44 * cVar3) + (long)local_40].u2_wd = (UWORD16)iVar9;
          }
          local_3c = iVar9 + local_3c;
          if ((psVar5[(int)cVar2].i2_pic_wd_in_ctb < local_3c) || (iVar9 < 1)) {
            return IHEVCD_INVALID_HEADER;
          }
        }
        local_3c = 0;
        for (local_40 = 0; local_40 < ppVar4[0x40].i1_num_tile_rows; local_40 = local_40 + 1) {
          if (ppVar4[0x40].i1_uniform_spacing_flag == '\0') {
            if (local_40 < ppVar4[0x40].i1_num_tile_rows + -1) {
              UVar7 = ihevcd_uev(in_stack_ffffffffffffff60);
              iVar9 = UVar7 + 1;
            }
            else {
              iVar9 = psVar5[(int)cVar2].i2_pic_ht_in_ctb - local_3c;
            }
          }
          else {
            iVar9 = ((local_40 + 1) * (int)psVar5[(int)cVar2].i2_pic_ht_in_ctb) /
                    (int)ppVar4[0x40].i1_num_tile_rows -
                    (local_40 * psVar5[(int)cVar2].i2_pic_ht_in_ctb) /
                    (int)ppVar4[0x40].i1_num_tile_rows;
          }
          for (local_44 = 0; local_44 < ppVar4[0x40].i1_num_tile_columns; local_44 = local_44 + 1) {
            ptVar6 = ppVar4[0x40].ps_tile;
            lVar11 = (long)(local_40 * ppVar4[0x40].i1_num_tile_columns);
            ptVar6[lVar11 + local_44].u1_pos_y = (UWORD8)local_3c;
            ptVar6[lVar11 + local_44].u2_ht = (UWORD16)iVar9;
          }
          local_3c = iVar9 + local_3c;
          if ((psVar5[(int)cVar2].i2_pic_ht_in_ctb < local_3c) || (iVar9 < 1)) {
            return IHEVCD_INVALID_HEADER;
          }
        }
        UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
        ppVar4[0x40].i1_loop_filter_across_tiles_enabled_flag = (WORD8)UVar7;
      }
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
      ppVar4[0x40].i1_loop_filter_across_slices_enabled_flag = (WORD8)UVar7;
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
      ppVar4[0x40].i1_deblocking_filter_control_present_flag = (WORD8)UVar7;
      ppVar4[0x40].i1_pic_disable_deblocking_filter_flag = '\0';
      ppVar4[0x40].i1_deblocking_filter_override_enabled_flag = '\0';
      ppVar4[0x40].i1_beta_offset_div2 = '\0';
      ppVar4[0x40].i1_tc_offset_div2 = '\0';
      if (ppVar4[0x40].i1_deblocking_filter_control_present_flag != '\0') {
        UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
        ppVar4[0x40].i1_deblocking_filter_override_enabled_flag = (WORD8)UVar7;
        UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
        ppVar4[0x40].i1_pic_disable_deblocking_filter_flag = (WORD8)UVar7;
        if (ppVar4[0x40].i1_pic_disable_deblocking_filter_flag == '\0') {
          WVar8 = ihevcd_sev(in_stack_ffffffffffffff68);
          ppVar4[0x40].i1_beta_offset_div2 = (WORD8)WVar8;
          WVar8 = ihevcd_sev(in_stack_ffffffffffffff68);
          ppVar4[0x40].i1_tc_offset_div2 = (WORD8)WVar8;
        }
      }
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
      ppVar4[0x40].i1_pps_scaling_list_data_present_flag = (WORD8)UVar7;
      if (ppVar4[0x40].i1_pps_scaling_list_data_present_flag != '\0') {
        memcpy(local_a8,&DAT_002df430,0x50);
        memcpy(ppVar10->pi2_scaling_mat,gi2_flat_scale_mat_32x32,0xc0);
        memcpy(ppVar10->pi2_scaling_mat + local_90,gi2_intra_default_scale_mat_8x8,0x80);
        memcpy(ppVar10->pi2_scaling_mat + local_8c,gi2_intra_default_scale_mat_8x8,0x80);
        memcpy(ppVar10->pi2_scaling_mat + local_88,gi2_intra_default_scale_mat_8x8,0x80);
        memcpy(ppVar10->pi2_scaling_mat + local_84,gi2_inter_default_scale_mat_8x8,0x80);
        memcpy(ppVar10->pi2_scaling_mat + local_80,gi2_inter_default_scale_mat_8x8,0x80);
        memcpy(ppVar10->pi2_scaling_mat + local_7c,gi2_inter_default_scale_mat_8x8,0x80);
        memcpy(ppVar10->pi2_scaling_mat + local_78,gi2_intra_default_scale_mat_16x16,0x200);
        memcpy(ppVar10->pi2_scaling_mat + local_74,gi2_intra_default_scale_mat_16x16,0x200);
        memcpy(ppVar10->pi2_scaling_mat + local_70,gi2_intra_default_scale_mat_16x16,0x200);
        memcpy(ppVar10->pi2_scaling_mat + local_6c,gi2_inter_default_scale_mat_16x16,0x200);
        memcpy(ppVar10->pi2_scaling_mat + local_68,gi2_inter_default_scale_mat_16x16,0x200);
        memcpy(ppVar10->pi2_scaling_mat + local_64,gi2_inter_default_scale_mat_16x16,0x200);
        memcpy(ppVar10->pi2_scaling_mat + local_60,gi2_intra_default_scale_mat_32x32,0x800);
        memcpy(ppVar10->pi2_scaling_mat + local_5c,gi2_inter_default_scale_mat_32x32,0x800);
        ihevcd_scaling_list_data(in_RDI,(WORD16 *)CONCAT44(local_4,UVar7));
      }
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
      ppVar4[0x40].i1_lists_modification_present_flag = (WORD8)UVar7;
      UVar7 = ihevcd_uev(in_stack_ffffffffffffff60);
      ppVar4[0x40].i1_log2_parallel_merge_level = (char)UVar7 + '\x02';
      UVar7 = ihevcd_bits_get(ps_bitstrm_00,1);
      ppVar4[0x40].i1_slice_header_extension_present_flag = (WORD8)UVar7;
      ihevcd_bits_get(ps_bitstrm_00,1);
      in_RDI->i4_pps_done = 1;
    }
  }
  return local_4;
}

Assistant:

IHEVCD_ERROR_T ihevcd_parse_pps(codec_t *ps_codec)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 value;
    WORD32 pps_id;

    pps_t *ps_pps;
    sps_t *ps_sps;
    bitstrm_t *ps_bitstrm = &ps_codec->s_parse.s_bitstrm;


    if(0 == ps_codec->i4_sps_done)
        return IHEVCD_INVALID_HEADER;

    UEV_PARSE("pic_parameter_set_id", value, ps_bitstrm);

    pps_id = value;
    if((pps_id >= MAX_PPS_CNT) || (pps_id < 0))
    {
        if(ps_codec->i4_pps_done)
            return IHEVCD_UNSUPPORTED_PPS_ID;
        else
            pps_id = 0;
    }


    ps_pps = (ps_codec->s_parse.ps_pps_base + MAX_PPS_CNT - 1);

    ps_pps->i1_pps_id = pps_id;

    UEV_PARSE("seq_parameter_set_id", value, ps_bitstrm);
    ps_pps->i1_sps_id = value;
    ps_pps->i1_sps_id = CLIP3(ps_pps->i1_sps_id, 0, MAX_SPS_CNT - 2);

    ps_sps = (ps_codec->s_parse.ps_sps_base + ps_pps->i1_sps_id);

    /* If the SPS that is being referred to has not been parsed,
     * copy an existing SPS to the current location */
    if(0 == ps_sps->i1_sps_valid)
    {
        return IHEVCD_INVALID_HEADER;

/*
        sps_t *ps_sps_ref = ps_codec->ps_sps_base;
        while(0 == ps_sps_ref->i1_sps_valid)
            ps_sps_ref++;
        ihevcd_copy_sps(ps_codec, ps_pps->i1_sps_id, ps_sps_ref->i1_sps_id);
*/
    }

    BITS_PARSE("dependent_slices_enabled_flag", value, ps_bitstrm, 1);
    ps_pps->i1_dependent_slice_enabled_flag = value;

    BITS_PARSE("output_flag_present_flag", value, ps_bitstrm, 1);
    ps_pps->i1_output_flag_present_flag = value;

    BITS_PARSE("num_extra_slice_header_bits", value, ps_bitstrm, 3);
    ps_pps->i1_num_extra_slice_header_bits = value;


    BITS_PARSE("sign_data_hiding_flag", value, ps_bitstrm, 1);
    ps_pps->i1_sign_data_hiding_flag = value;

    BITS_PARSE("cabac_init_present_flag", value, ps_bitstrm, 1);
    ps_pps->i1_cabac_init_present_flag = value;

    UEV_PARSE("num_ref_idx_l0_default_active_minus1", value, ps_bitstrm);
    ps_pps->i1_num_ref_idx_l0_default_active = value + 1;

    UEV_PARSE("num_ref_idx_l1_default_active_minus1", value, ps_bitstrm);
    ps_pps->i1_num_ref_idx_l1_default_active = value + 1;

    SEV_PARSE("pic_init_qp_minus26", value, ps_bitstrm);
    ps_pps->i1_pic_init_qp = value + 26;

    BITS_PARSE("constrained_intra_pred_flag", value, ps_bitstrm, 1);
    ps_pps->i1_constrained_intra_pred_flag = value;

    BITS_PARSE("transform_skip_enabled_flag", value, ps_bitstrm, 1);
    ps_pps->i1_transform_skip_enabled_flag = value;

    BITS_PARSE("cu_qp_delta_enabled_flag", value, ps_bitstrm, 1);
    ps_pps->i1_cu_qp_delta_enabled_flag = value;

    if(ps_pps->i1_cu_qp_delta_enabled_flag)
    {
        UEV_PARSE("diff_cu_qp_delta_depth", value, ps_bitstrm);
        ps_pps->i1_diff_cu_qp_delta_depth = value;
    }
    else
    {
        ps_pps->i1_diff_cu_qp_delta_depth = 0;
    }
    ps_pps->i1_log2_min_cu_qp_delta_size = ps_sps->i1_log2_ctb_size - ps_pps->i1_diff_cu_qp_delta_depth;
    /* Print different */
    SEV_PARSE("cb_qp_offset", value, ps_bitstrm);
    ps_pps->i1_pic_cb_qp_offset = value;

    /* Print different */
    SEV_PARSE("cr_qp_offset", value, ps_bitstrm);
    ps_pps->i1_pic_cr_qp_offset = value;

    /* Print different */
    BITS_PARSE("slicelevel_chroma_qp_flag", value, ps_bitstrm, 1);
    ps_pps->i1_pic_slice_level_chroma_qp_offsets_present_flag = value;

    BITS_PARSE("weighted_pred_flag", value, ps_bitstrm, 1);
    ps_pps->i1_weighted_pred_flag = value;

    BITS_PARSE("weighted_bipred_flag", value, ps_bitstrm, 1);
    ps_pps->i1_weighted_bipred_flag = value;

    BITS_PARSE("transquant_bypass_enable_flag", value, ps_bitstrm, 1);
    ps_pps->i1_transquant_bypass_enable_flag = value;

    BITS_PARSE("tiles_enabled_flag", value, ps_bitstrm, 1);
    ps_pps->i1_tiles_enabled_flag = value;

    BITS_PARSE("entropy_coding_sync_enabled_flag", value, ps_bitstrm, 1);
    ps_pps->i1_entropy_coding_sync_enabled_flag = value;

    ps_pps->i1_loop_filter_across_tiles_enabled_flag = 0;
    if(ps_pps->i1_tiles_enabled_flag)
    {
        UEV_PARSE("num_tile_columns_minus1", value, ps_bitstrm);
        ps_pps->i1_num_tile_columns = value + 1;

        UEV_PARSE("num_tile_rows_minus1", value, ps_bitstrm);
        ps_pps->i1_num_tile_rows = value + 1;

        if((ps_pps->i1_num_tile_columns < 1) ||
                        (ps_pps->i1_num_tile_columns > ps_sps->i2_pic_wd_in_ctb) ||
                        (ps_pps->i1_num_tile_rows < 1) ||
                        (ps_pps->i1_num_tile_rows > ps_sps->i2_pic_ht_in_ctb))
            return IHEVCD_INVALID_HEADER;

        BITS_PARSE("uniform_spacing_flag", value, ps_bitstrm, 1);
        ps_pps->i1_uniform_spacing_flag = value;


        {

            WORD32 start;
            WORD32 i, j;


            start = 0;
            for(i = 0; i < ps_pps->i1_num_tile_columns; i++)
            {
                tile_t *ps_tile;
                if(!ps_pps->i1_uniform_spacing_flag)
                {
                    if(i < (ps_pps->i1_num_tile_columns - 1))
                    {
                        UEV_PARSE("column_width_minus1[ i ]", value, ps_bitstrm);
                        value += 1;
                    }
                    else
                    {
                        value = ps_sps->i2_pic_wd_in_ctb - start;
                    }
                }
                else
                {
                    value = ((i + 1) * ps_sps->i2_pic_wd_in_ctb) / ps_pps->i1_num_tile_columns -
                                    (i * ps_sps->i2_pic_wd_in_ctb) / ps_pps->i1_num_tile_columns;
                }

                for(j = 0; j < ps_pps->i1_num_tile_rows; j++)
                {
                    ps_tile = ps_pps->ps_tile + j * ps_pps->i1_num_tile_columns + i;
                    ps_tile->u1_pos_x = start;
                    ps_tile->u2_wd = value;
                }
                start += value;

                if((start > ps_sps->i2_pic_wd_in_ctb) ||
                                (value <= 0))
                    return IHEVCD_INVALID_HEADER;
            }

            start = 0;
            for(i = 0; i < (ps_pps->i1_num_tile_rows); i++)
            {
                tile_t *ps_tile;
                if(!ps_pps->i1_uniform_spacing_flag)
                {
                    if(i < (ps_pps->i1_num_tile_rows - 1))
                    {

                        UEV_PARSE("row_height_minus1[ i ]", value, ps_bitstrm);
                        value += 1;
                    }
                    else
                    {
                        value = ps_sps->i2_pic_ht_in_ctb - start;
                    }
                }
                else
                {
                    value = ((i + 1) * ps_sps->i2_pic_ht_in_ctb) / ps_pps->i1_num_tile_rows -
                                    (i * ps_sps->i2_pic_ht_in_ctb) / ps_pps->i1_num_tile_rows;
                }

                for(j = 0; j < ps_pps->i1_num_tile_columns; j++)
                {
                    ps_tile = ps_pps->ps_tile + i * ps_pps->i1_num_tile_columns + j;
                    ps_tile->u1_pos_y = start;
                    ps_tile->u2_ht = value;
                }
                start += value;

                if((start > ps_sps->i2_pic_ht_in_ctb) ||
                                (value <= 0))
                    return IHEVCD_INVALID_HEADER;
            }
        }


        BITS_PARSE("loop_filter_across_tiles_enabled_flag", value, ps_bitstrm, 1);
        ps_pps->i1_loop_filter_across_tiles_enabled_flag = value;

    }
    else
    {
        /* If tiles are not present, set first tile in each PPS to have tile
        width and height equal to picture width and height */
        ps_pps->i1_num_tile_columns = 1;
        ps_pps->i1_num_tile_rows = 1;
        ps_pps->i1_uniform_spacing_flag = 1;

        ps_pps->ps_tile->u1_pos_x = 0;
        ps_pps->ps_tile->u1_pos_y = 0;
        ps_pps->ps_tile->u2_wd = ps_sps->i2_pic_wd_in_ctb;
        ps_pps->ps_tile->u2_ht = ps_sps->i2_pic_ht_in_ctb;
    }

    BITS_PARSE("loop_filter_across_slices_enabled_flag", value, ps_bitstrm, 1);
    ps_pps->i1_loop_filter_across_slices_enabled_flag = value;

    BITS_PARSE("deblocking_filter_control_present_flag", value, ps_bitstrm, 1);
    ps_pps->i1_deblocking_filter_control_present_flag = value;

    /* Default values */
    ps_pps->i1_pic_disable_deblocking_filter_flag = 0;
    ps_pps->i1_deblocking_filter_override_enabled_flag = 0;
    ps_pps->i1_beta_offset_div2 = 0;
    ps_pps->i1_tc_offset_div2 = 0;

    if(ps_pps->i1_deblocking_filter_control_present_flag)
    {

        BITS_PARSE("deblocking_filter_override_enabled_flag", value, ps_bitstrm, 1);
        ps_pps->i1_deblocking_filter_override_enabled_flag = value;

        BITS_PARSE("pic_disable_deblocking_filter_flag", value, ps_bitstrm, 1);
        ps_pps->i1_pic_disable_deblocking_filter_flag = value;

        if(!ps_pps->i1_pic_disable_deblocking_filter_flag)
        {

            SEV_PARSE("pps_beta_offset_div2", value, ps_bitstrm);
            ps_pps->i1_beta_offset_div2 = value;

            SEV_PARSE("pps_tc_offset_div2", value, ps_bitstrm);
            ps_pps->i1_tc_offset_div2 = value;

        }
    }

    BITS_PARSE("pps_scaling_list_data_present_flag", value, ps_bitstrm, 1);
    ps_pps->i1_pps_scaling_list_data_present_flag = value;

    if(ps_pps->i1_pps_scaling_list_data_present_flag)
    {
        COPY_DEFAULT_SCALING_LIST(ps_pps->pi2_scaling_mat);
        ihevcd_scaling_list_data(ps_codec, ps_pps->pi2_scaling_mat);
    }

    BITS_PARSE("lists_modification_present_flag", value, ps_bitstrm, 1);
    ps_pps->i1_lists_modification_present_flag = value;
    UEV_PARSE("log2_parallel_merge_level_minus2", value, ps_bitstrm);
    ps_pps->i1_log2_parallel_merge_level = value + 2;

    BITS_PARSE("slice_header_extension_present_flag", value, ps_bitstrm, 1);
    ps_pps->i1_slice_header_extension_present_flag = value;
    /* Not present in HM */
    BITS_PARSE("pps_extension_flag", value, ps_bitstrm, 1);

    ps_codec->i4_pps_done = 1;
    return ret;
}